

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O0

void ImStb::stb_text_undo(ImGuiInputTextState *str,STB_TexteditState *state)

{
  ImWchar IVar1;
  StbUndoRecord *pSVar2;
  StbUndoState *in_RSI;
  ImGuiInputTextState *in_RDI;
  int i;
  StbUndoRecord *r;
  StbUndoRecord u;
  StbUndoState *s;
  int iVar3;
  ImGuiInputTextState *obj;
  undefined8 uVar4;
  ImGuiInputTextState *obj_00;
  StbUndoRecord *new_text;
  
  new_text = in_RSI->undo_rec + 2;
  if (*(short *)((long)&in_RSI[1].undo_rec[1].where + 2) != 0) {
    pSVar2 = new_text + (*(short *)((long)&in_RSI[1].undo_rec[1].where + 2) + -1);
    uVar4._0_4_ = pSVar2->where;
    uVar4._4_4_ = pSVar2->insert_length;
    obj_00 = *(ImGuiInputTextState **)&pSVar2->delete_length;
    pSVar2 = new_text + ((short)in_RSI[1].undo_rec[1].insert_length + -1);
    pSVar2->char_storage = -1;
    iVar3 = (int)obj_00;
    pSVar2->insert_length = iVar3;
    pSVar2->delete_length = uVar4._4_4_;
    pSVar2->where = (undefined4)uVar4;
    if (iVar3 != 0) {
      if (in_RSI[1].undo_rec[1].delete_length + iVar3 < 999) {
        while (iVar3 = (int)obj_00,
              *(int *)((long)(new_text + 0xe0) + 8) < *(int *)((long)(new_text + 0xe0) + 4) + iVar3)
        {
          if (*(ImWchar *)(new_text + 0xe0) == 99) {
            return;
          }
          stb_textedit_discard_redo(in_RSI);
        }
        obj = (ImGuiInputTextState *)(new_text + ((short)*(ImWchar *)(new_text + 0xe0) + -1));
        *(int *)&obj->field_0xc = *(int *)((long)(new_text + 0xe0) + 8) - iVar3;
        *(int *)((long)(new_text + 0xe0) + 8) = *(int *)((long)(new_text + 0xe0) + 8) - iVar3;
        for (iVar3 = 0; iVar3 < (int)obj_00; iVar3 = iVar3 + 1) {
          IVar1 = STB_TEXTEDIT_GETCHAR(obj,iVar3);
          *(ImWchar *)((long)(new_text + 99) + (long)(*(int *)&obj->field_0xc + iVar3) * 2) = IVar1;
        }
      }
      else {
        pSVar2->insert_length = 0;
      }
      STB_TEXTEDIT_DELETECHARS(obj_00,(int)((ulong)uVar4 >> 0x20),(int)uVar4);
    }
    if ((int)((ulong)uVar4 >> 0x20) != 0) {
      STB_TEXTEDIT_INSERTCHARS
                (in_RDI,(int)((ulong)in_RSI >> 0x20),(ImWchar *)new_text,
                 (int)((ulong)obj_00 >> 0x20));
      *(int *)((long)(new_text + 0xe0) + 4) =
           *(int *)((long)(new_text + 0xe0) + 4) - (int)((ulong)uVar4 >> 0x20);
    }
    in_RSI->undo_rec[0].where = (int)uVar4 + (int)((ulong)uVar4 >> 0x20);
    *(ImWchar *)((long)(new_text + 0xdf) + 0xe) = *(ImWchar *)((long)(new_text + 0xdf) + 0xe) - 1;
    *(ImWchar *)(new_text + 0xe0) = *(ImWchar *)(new_text + 0xe0) - 1;
  }
  return;
}

Assistant:

static void stb_text_undo(STB_TEXTEDIT_STRING *str, STB_TexteditState *state)
{
   StbUndoState *s = &state->undostate;
   StbUndoRecord u, *r;
   if (s->undo_point == 0)
      return;

   // we need to do two things: apply the undo record, and create a redo record
   u = s->undo_rec[s->undo_point-1];
   r = &s->undo_rec[s->redo_point-1];
   r->char_storage = -1;

   r->insert_length = u.delete_length;
   r->delete_length = u.insert_length;
   r->where = u.where;

   if (u.delete_length) {
      // if the undo record says to delete characters, then the redo record will
      // need to re-insert the characters that get deleted, so we need to store
      // them.

      // there are three cases:
      //    there's enough room to store the characters
      //    characters stored for *redoing* don't leave room for redo
      //    characters stored for *undoing* don't leave room for redo
      // if the last is true, we have to bail

      if (s->undo_char_point + u.delete_length >= STB_TEXTEDIT_UNDOCHARCOUNT) {
         // the undo records take up too much character space; there's no space to store the redo characters
         r->insert_length = 0;
      } else {
         int i;

         // there's definitely room to store the characters eventually
         while (s->undo_char_point + u.delete_length > s->redo_char_point) {
            // should never happen:
            if (s->redo_point == STB_TEXTEDIT_UNDOSTATECOUNT)
               return;
            // there's currently not enough room, so discard a redo record
            stb_textedit_discard_redo(s);
         }
         r = &s->undo_rec[s->redo_point-1];

         r->char_storage = s->redo_char_point - u.delete_length;
         s->redo_char_point = s->redo_char_point - u.delete_length;

         // now save the characters
         for (i=0; i < u.delete_length; ++i)
            s->undo_char[r->char_storage + i] = STB_TEXTEDIT_GETCHAR(str, u.where + i);
      }

      // now we can carry out the deletion
      STB_TEXTEDIT_DELETECHARS(str, u.where, u.delete_length);
   }

   // check type of recorded action:
   if (u.insert_length) {
      // easy case: was a deletion, so we need to insert n characters
      STB_TEXTEDIT_INSERTCHARS(str, u.where, &s->undo_char[u.char_storage], u.insert_length);
      s->undo_char_point -= u.insert_length;
   }

   state->cursor = u.where + u.insert_length;

   s->undo_point--;
   s->redo_point--;
}